

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O2

void __thiscall diffusion::FileReader::FileReader(FileReader *this,string *file_name)

{
  bool bVar1;
  ErrorDataCorruption *this_00;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_00108c20;
  std::ifstream::ifstream(&this->file_);
  std::
  _Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->data_queue_).
                 super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               );
  std::ifstream::open((string *)&this->file_,(_Ios_Openmode)file_name);
  bVar1 = is_file_valid(this);
  if (bVar1) {
    return;
  }
  this_00 = (ErrorDataCorruption *)__cxa_allocate_exception(0x10);
  ErrorDataCorruption::ErrorDataCorruption(this_00);
  __cxa_throw(this_00,&ErrorDataCorruption::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileReader::FileReader(std::string const & file_name) {
    try {
        file_.open(file_name);
    } catch (std::exception const & e) {
        throw ErrorFileOpening();
    }
    if (!this->is_file_valid()) {
        throw ErrorDataCorruption();
    }
}